

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O0

void __thiscall read_surfmap::operator()(read_surfmap *this,xr_surfmap **_smap,xr_reader *r)

{
  xr_object *this_00;
  uint32_t uVar1;
  xr_surfmap *pxVar2;
  char *__s;
  xr_surface *pxVar3;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *name;
  xr_surfmap *local_28;
  xr_surfmap *smap;
  xr_reader *r_local;
  xr_surfmap **_smap_local;
  read_surfmap *this_local;
  
  smap = (xr_surfmap *)r;
  r_local = (xr_reader *)_smap;
  _smap_local = (xr_surfmap **)this;
  pxVar2 = (xr_surfmap *)operator_new(0x20);
  xray_re::xr_surfmap::xr_surfmap(pxVar2);
  r_local->_vptr_xr_reader = (_func_int **)pxVar2;
  local_28 = pxVar2;
  __s = xray_re::xr_reader::skip_sz((xr_reader *)smap);
  this_00 = this->object;
  local_40 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  pxVar3 = xray_re::xr_object::find_surface(this_00,&local_60);
  local_28->surface = pxVar3;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pxVar2 = smap;
  uVar1 = xray_re::xr_reader::r_u32((xr_reader *)smap);
  xray_re::xr_reader::r_seq<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((xr_reader *)pxVar2,(ulong)uVar1,&local_28->faces);
  return;
}

Assistant:

void operator()(xr_surfmap*& _smap, xr_reader& r) const {
		xr_surfmap* smap = new xr_surfmap;
		_smap = smap;
		const char* name = r.skip_sz();
		smap->surface = object.find_surface(name);
		r.r_seq(r.r_u32(), smap->faces);
	}